

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solverational.hpp
# Opt level: O1

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::_updateReducedCosts
          (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,SolRational *sol,int *dualSize,int *numCorrectedPrimals)

{
  int iVar1;
  Verbosity VVar2;
  int iVar3;
  Verbosity old_verbosity;
  
  if (*dualSize <
      (this->_primalDualDiff).
      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      .memused) {
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::getObj(this->_rationalLP,&sol->_redCost);
    (*(this->_rationalLP->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
      ._vptr_ClassArray[0x4a])(this->_rationalLP,&sol->_dual,&sol->_redCost);
  }
  else {
    (*(this->_rationalLP->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
      ._vptr_ClassArray[0x49])
              (this->_rationalLP,
               &(this->_primalDualDiff).
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
               ,&sol->_redCost);
  }
  iVar1 = (this->_primalDualDiff).
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          .memused;
  iVar3 = *numCorrectedPrimals + iVar1;
  if ((iVar3 != 0 && SCARRY4(*numCorrectedPrimals,iVar1) == iVar3 < 0) &&
     (VVar2 = (this->spxout).m_verbosity, 3 < (int)VVar2)) {
    (this->spxout).m_verbosity = INFO2;
    std::__ostream_insert<char,std::char_traits<char>>((this->spxout).m_streams[4],"Corrected ",10);
    std::ostream::operator<<
              ((ostream *)(this->spxout).m_streams[(this->spxout).m_verbosity],*numCorrectedPrimals)
    ;
    std::__ostream_insert<char,std::char_traits<char>>
              ((this->spxout).m_streams[(this->spxout).m_verbosity]," primal variables and ",0x16);
    std::ostream::operator<<((ostream *)(this->spxout).m_streams[(this->spxout).m_verbosity],iVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((this->spxout).m_streams[(this->spxout).m_verbosity]," dual values.\n",0xe);
    (this->spxout).m_verbosity = VVar2;
  }
  return;
}

Assistant:

void SoPlexBase<R>::_updateReducedCosts(SolRational& sol, int& dualSize,
                                        const int& numCorrectedPrimals)
{

   if(_primalDualDiff.size() < dualSize + 1)
   {
      _rationalLP->addDualActivity(_primalDualDiff, sol._redCost);
#ifndef NDEBUG
      {
         VectorRational activity(_rationalLP->maxObj());
         activity *= -1;
         _rationalLP->subDualActivity(sol._dual, activity);
      }
#endif
   }
   else
   {
      // we assume that the objective function vector has less nonzeros than the reduced cost vector, and so multiplying
      // with -1 first and subtracting the dual activity should be faster than adding the dual activity and negating
      // afterwards
      _rationalLP->getObj(sol._redCost);
      _rationalLP->subDualActivity(sol._dual, sol._redCost);
   }

   const int numCorrectedDuals = _primalDualDiff.size();

   if(numCorrectedPrimals + numCorrectedDuals > 0)
   {
      SPX_MSG_INFO2(spxout, spxout << "Corrected " << numCorrectedPrimals << " primal variables and " <<
                    numCorrectedDuals << " dual values.\n");
   }
}